

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitPla.c
# Opt level: O3

void Kit_PlaToIsop(char *pSop,Vec_Int_t *vCover)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  
  uVar3 = 0xfffffffd;
  for (uVar7 = 1; pSop[uVar7 - 1] != '\n'; uVar7 = uVar7 + 1) {
    if (pSop[uVar7 - 1] == '\0') goto LAB_005dc087;
    uVar3 = uVar3 + 1;
  }
  if ((int)(uVar3 + 1) < 1) {
LAB_005dc087:
    __assert_fail("nVars > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                  ,0x11f,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
  }
  vCover->nSize = 0;
  if (*pSop != '\0') {
    uVar7 = uVar7 & 0xffffffff;
    pcVar8 = pSop + uVar3;
    do {
      iVar9 = 0;
      pcVar4 = pcVar8;
      iVar6 = uVar3 + 1;
      do {
        cVar1 = *pcVar4;
        if (cVar1 == '-') {
          iVar9 = iVar9 << 2;
        }
        else if (cVar1 == '1') {
          iVar9 = iVar9 * 4 + 2;
        }
        else {
          if (cVar1 != '0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitPla.c"
                          ,0x12d,"void Kit_PlaToIsop(char *, Vec_Int_t *)");
          }
          iVar9 = iVar9 * 4 + 1;
        }
        iVar6 = iVar6 + -1;
        pcVar4 = pcVar4 + -1;
      } while (0 < iVar6);
      uVar2 = vCover->nSize;
      if (uVar2 == vCover->nCap) {
        if ((int)uVar2 < 0x10) {
          if (vCover->pArray == (int *)0x0) {
            piVar5 = (int *)malloc(0x40);
          }
          else {
            piVar5 = (int *)realloc(vCover->pArray,0x40);
          }
          vCover->pArray = piVar5;
          if (piVar5 == (int *)0x0) {
LAB_005dc0a6:
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          vCover->nCap = 0x10;
        }
        else {
          if (vCover->pArray == (int *)0x0) {
            piVar5 = (int *)malloc((ulong)uVar2 * 8);
          }
          else {
            piVar5 = (int *)realloc(vCover->pArray,(ulong)uVar2 * 8);
          }
          vCover->pArray = piVar5;
          if (piVar5 == (int *)0x0) goto LAB_005dc0a6;
          vCover->nCap = uVar2 * 2;
        }
      }
      else {
        piVar5 = vCover->pArray;
      }
      iVar6 = vCover->nSize;
      vCover->nSize = iVar6 + 1;
      piVar5[iVar6] = iVar9;
      pcVar8 = pcVar8 + uVar7;
      pcVar4 = pSop + uVar7;
      pSop = pSop + uVar7;
    } while (*pcVar4 != '\0');
  }
  return;
}

Assistant:

void Kit_PlaToIsop( char * pSop, Vec_Int_t * vCover )
{
    char * pCube;
    int k, nVars, Entry;
    nVars = Kit_PlaGetVarNum( pSop );
    assert( nVars > 0 );
    // create cubes
    Vec_IntClear( vCover );
    for ( pCube = pSop; *pCube; pCube += nVars + 3 )
    {
        Entry = 0;
        for ( k = nVars - 1; k >= 0; k-- )
            if ( pCube[k] == '0' )
                Entry = (Entry << 2) | 1;
            else if ( pCube[k] == '1' )
                Entry = (Entry << 2) | 2;
            else if ( pCube[k] == '-' )
                Entry = (Entry << 2);
            else 
                assert( 0 );
        Vec_IntPush( vCover, Entry );
    }
}